

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

string * __thiscall
flatbuffers::go::GoGenerator::GenGetter_abi_cxx11_
          (string *__return_storage_ptr__,GoGenerator *this,Type *type)

{
  BaseType BVar1;
  char *__s;
  undefined1 local_60 [32];
  string local_40;
  
  BVar1 = type->base_type;
  if (BVar1 == BASE_TYPE_UNION) {
    __s = "rcv._tab.Union";
  }
  else {
    if (BVar1 == BASE_TYPE_VECTOR) {
      local_60._0_4_ = type->element;
      local_60._24_2_ = type->fixed_length;
      local_60._4_4_ = BASE_TYPE_NONE;
      local_60._8_8_ = type->struct_def;
      local_60._16_8_ = type->enum_def;
      GenGetter_abi_cxx11_(__return_storage_ptr__,this,(Type *)local_60);
      return __return_storage_ptr__;
    }
    if (BVar1 != BASE_TYPE_STRING) {
      GenTypeBasic_abi_cxx11_(&local_40,this,type);
      (*(this->namer_).super_Namer._vptr_Namer[0x14])
                (local_60,&this->namer_,&local_40,
                 (ulong)(this->namer_).super_Namer.config_.functions);
      std::operator+(__return_storage_ptr__,"rcv._tab.Get",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      std::__cxx11::string::~string((string *)local_60);
      std::__cxx11::string::~string((string *)&local_40);
      return __return_storage_ptr__;
    }
    __s = "rcv._tab.ByteVector";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string GenGetter(const Type &type) {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "rcv._tab.ByteVector";
      case BASE_TYPE_UNION: return "rcv._tab.Union";
      case BASE_TYPE_VECTOR: return GenGetter(type.VectorType());
      default: return "rcv._tab.Get" + namer_.Function(GenTypeBasic(type));
    }
  }